

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O0

void ssh2_bpp_format_packet_inner(ssh2_bpp_state *s,PktOut *pkt)

{
  LogContext *ctx;
  int iVar1;
  int iVar2;
  char *texttype;
  ssh_cipheralg *psVar3;
  ssh2_macalg *psVar4;
  ptrlen pkt_00;
  int local_cc;
  byte local_b9;
  int local_b8;
  int local_b4;
  int local_a0;
  int local_9c;
  int newlen;
  int minlen;
  uchar *newpayload;
  undefined1 local_88 [4];
  int nblanks;
  logblank_t blanks [4];
  void *local_50;
  ptrlen pktdata;
  int i;
  int unencrypted_prefix;
  int padding;
  int maclen;
  int cipherblk;
  int origlen;
  PktOut *pkt_local;
  ssh2_bpp_state *s_local;
  
  if ((s->bpp).logctx != (LogContext *)0x0) {
    pkt_00 = make_ptrlen(pkt->data + pkt->prefix,pkt->length - pkt->prefix);
    newpayload._4_4_ = ssh2_censor_packet((s->bpp).pls,pkt->type,true,pkt_00,(logblank_t *)local_88)
    ;
    ctx = (s->bpp).logctx;
    iVar1 = pkt->type;
    texttype = ssh2_pkt_type(((s->bpp).pls)->kctx,((s->bpp).pls)->actx,pkt->type);
    local_50 = pkt_00.ptr;
    pktdata.ptr = (void *)pkt_00.len;
    log_packet(ctx,1,iVar1,texttype,local_50,(size_t)pktdata.ptr,newpayload._4_4_,
               (logblank_t *)local_88,&(s->out).sequence,pkt->downstream_id,pkt->additional_log_text
              );
  }
  if ((s->out).cipher == (ssh_cipher *)0x0) {
    local_b4 = 8;
  }
  else {
    psVar3 = ssh_cipher_alg((s->out).cipher);
    local_b4 = psVar3->blksize;
  }
  if (local_b4 < 8) {
    local_b8 = 8;
  }
  else {
    local_b8 = local_b4;
  }
  if (s->out_comp != (ssh_compressor *)0x0) {
    local_9c = (int)pkt->minlen;
    if (local_9c != 0) {
      if ((s->out).mac != (ssh2_mac *)0x0) {
        psVar4 = ssh2_mac_alg((s->out).mac);
        local_9c = local_9c - psVar4->len;
      }
      local_9c = local_9c + -8;
    }
    ssh_compressor_compress
              (s->out_comp,pkt->data + 5,(int)pkt->length + -5,(uchar **)&newlen,&local_a0,local_9c)
    ;
    pkt->length = 5;
    BinarySink_put_data(pkt->binarysink_,_newlen,(long)local_a0);
    safefree(_newlen);
  }
  local_b9 = 0;
  if ((s->out).mac != (ssh2_mac *)0x0) {
    local_b9 = (s->out).etm_mode;
  }
  iVar1 = 0;
  if ((local_b9 & 1) != 0) {
    iVar1 = 4;
  }
  iVar1 = (int)(((long)local_b8 - ((pkt->length - (long)iVar1) + 4) % (ulong)(long)local_b8) %
               (ulong)(long)local_b8) + 4;
  if (0xff < iVar1) {
    __assert_fail("padding <= 255",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp2.c",
                  0x318,"void ssh2_bpp_format_packet_inner(struct ssh2_bpp_state *, PktOut *)");
  }
  if ((s->out).mac == (ssh2_mac *)0x0) {
    local_cc = 0;
  }
  else {
    psVar4 = ssh2_mac_alg((s->out).mac);
    local_cc = psVar4->len;
  }
  iVar2 = (int)pkt->length;
  for (pktdata.len._0_4_ = 0; (int)pktdata.len < iVar1; pktdata.len._0_4_ = (int)pktdata.len + 1) {
    BinarySink_put_byte(pkt->binarysink_,'\0');
  }
  random_read(pkt->data + iVar2,(long)iVar1);
  pkt->data[4] = (uchar)iVar1;
  PUT_32BIT_MSB_FIRST(pkt->data,(iVar2 + iVar1) - 4);
  if (((s->out).cipher != (ssh_cipher *)0x0) &&
     (psVar3 = ssh_cipher_alg((s->out).cipher), (psVar3->flags & 2) != 0)) {
    ssh_cipher_encrypt_length((s->out).cipher,pkt->data,4,(s->out).sequence);
  }
  BinarySink_put_padding(pkt->binarysink_,(long)local_cc,'\0');
  if (((s->out).mac == (ssh2_mac *)0x0) || (((s->out).etm_mode & 1U) == 0)) {
    if ((s->out).mac != (ssh2_mac *)0x0) {
      ssh2_mac_generate((s->out).mac,pkt->data,iVar2 + iVar1,(s->out).sequence);
    }
    if ((s->out).cipher != (ssh_cipher *)0x0) {
      ssh_cipher_encrypt((s->out).cipher,pkt->data,iVar2 + iVar1);
    }
  }
  else {
    if ((s->out).cipher != (ssh_cipher *)0x0) {
      ssh_cipher_encrypt((s->out).cipher,pkt->data + 4,iVar2 + iVar1 + -4);
    }
    ssh2_mac_generate((s->out).mac,pkt->data,iVar2 + iVar1,(s->out).sequence);
  }
  (s->out).sequence = (s->out).sequence + 1;
  dts_consume(&s->stats->out,(long)(iVar2 + iVar1));
  return;
}

Assistant:

static void ssh2_bpp_format_packet_inner(struct ssh2_bpp_state *s, PktOut *pkt)
{
    int origlen, cipherblk, maclen, padding, unencrypted_prefix, i;

    if (s->bpp.logctx) {
        ptrlen pktdata = make_ptrlen(pkt->data + pkt->prefix,
                                     pkt->length - pkt->prefix);
        logblank_t blanks[MAX_BLANKS];
        int nblanks = ssh2_censor_packet(
            s->bpp.pls, pkt->type, true, pktdata, blanks);
        log_packet(s->bpp.logctx, PKT_OUTGOING, pkt->type,
                   ssh2_pkt_type(s->bpp.pls->kctx, s->bpp.pls->actx,
                                 pkt->type),
                   pktdata.ptr, pktdata.len, nblanks, blanks, &s->out.sequence,
                   pkt->downstream_id, pkt->additional_log_text);
    }

    cipherblk = s->out.cipher ? ssh_cipher_alg(s->out.cipher)->blksize : 8;
    cipherblk = cipherblk < 8 ? 8 : cipherblk;  /* or 8 if blksize < 8 */

    if (s->out_comp) {
        unsigned char *newpayload;
        int minlen, newlen;

        /*
         * Compress packet payload.
         */
        minlen = pkt->minlen;
        if (minlen) {
            /*
             * Work out how much compressed data we need (at least) to
             * make the overall packet length come to pkt->minlen.
             */
            if (s->out.mac)
                minlen -= ssh2_mac_alg(s->out.mac)->len;
            minlen -= 8;              /* length field + min padding */
        }

        ssh_compressor_compress(s->out_comp, pkt->data + 5, pkt->length - 5,
                                &newpayload, &newlen, minlen);
        pkt->length = 5;
        put_data(pkt, newpayload, newlen);
        sfree(newpayload);
    }

    /*
     * Add padding. At least four bytes, and must also bring total
     * length (minus MAC) up to a multiple of the block size.
     * If pkt->forcepad is set, make sure the packet is at least that size
     * after padding.
     */
    padding = 4;
    unencrypted_prefix = (s->out.mac && s->out.etm_mode) ? 4 : 0;
    padding +=
        (cipherblk - (pkt->length - unencrypted_prefix + padding) % cipherblk)
        % cipherblk;
    assert(padding <= 255);
    maclen = s->out.mac ? ssh2_mac_alg(s->out.mac)->len : 0;
    origlen = pkt->length;
    for (i = 0; i < padding; i++)
        put_byte(pkt, 0);              /* make space for random padding */
    random_read(pkt->data + origlen, padding);
    pkt->data[4] = padding;
    PUT_32BIT_MSB_FIRST(pkt->data, origlen + padding - 4);

    /* Encrypt length if the scheme requires it */
    if (s->out.cipher &&
        (ssh_cipher_alg(s->out.cipher)->flags & SSH_CIPHER_SEPARATE_LENGTH)) {
        ssh_cipher_encrypt_length(s->out.cipher, pkt->data, 4,
                                  s->out.sequence);
    }

    put_padding(pkt, maclen, 0);

    if (s->out.mac && s->out.etm_mode) {
        /*
         * OpenSSH-defined encrypt-then-MAC protocol.
         */
        if (s->out.cipher)
            ssh_cipher_encrypt(s->out.cipher,
                               pkt->data + 4, origlen + padding - 4);
        ssh2_mac_generate(s->out.mac, pkt->data, origlen + padding,
                          s->out.sequence);
    } else {
        /*
         * SSH-2 standard protocol.
         */
        if (s->out.mac)
            ssh2_mac_generate(s->out.mac, pkt->data, origlen + padding,
                              s->out.sequence);
        if (s->out.cipher)
            ssh_cipher_encrypt(s->out.cipher, pkt->data, origlen + padding);
    }

    s->out.sequence++;       /* whether or not we MACed */

    dts_consume(&s->stats->out, origlen + padding);
}